

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::posix_part_file::move_partfile(posix_part_file *this,string *path,error_code *ec)

{
  undefined8 code;
  bool bVar1;
  char *in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  string_view lhs;
  string_view lhs_00;
  string_view rhs;
  string_view rhs_00;
  undefined1 local_d8 [8];
  storage_error se;
  undefined1 local_80 [8];
  string new_path;
  undefined1 local_40 [8];
  string old_path;
  error_code *ec_local;
  string *path_local;
  posix_part_file *this_local;
  
  old_path.field_2._8_8_ = ec;
  flush_metadata_impl(this,ec);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)old_path.field_2._8_8_);
  if (bVar1) {
    return;
  }
  bVar1 = ::std::
          unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
          ::empty(&this->m_piece_map);
  if (bVar1) goto LAB_005309f2;
  auVar2 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  lhs._M_len = auVar2._8_8_;
  auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_name);
  new_path.field_2._8_8_ = auVar3._0_8_;
  lhs._M_str = (char *)new_path.field_2._8_8_;
  rhs._M_str = in_R9;
  rhs._M_len = auVar3._8_8_;
  combine_path_abi_cxx11_((string *)local_40,auVar2._0_8_,lhs,rhs);
  auVar2 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)path);
  lhs_00._M_len = auVar2._8_8_;
  auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_name);
  lhs_00._M_str = auVar3._0_8_;
  rhs_00._M_str = in_R9;
  rhs_00._M_len = auVar3._8_8_;
  combine_path_abi_cxx11_((string *)local_80,auVar2._0_8_,lhs_00,rhs_00);
  rename((libtorrent *)local_40,local_80,(char *)old_path.field_2._8_8_);
  code = old_path.field_2._8_8_;
  boost::system::error_condition::error_condition<boost::system::errc::errc_t>
            ((error_condition *)&se.field_0x10,no_such_file_or_directory,(type *)0x0);
  bVar1 = boost::system::operator==((error_code *)code,(error_condition *)&se.field_0x10);
  if (bVar1) {
    boost::system::error_code::clear((error_code *)old_path.field_2._8_8_);
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)old_path.field_2._8_8_);
  if (bVar1) {
    storage_error::storage_error((storage_error *)local_d8);
    copy_file((string *)local_40,(string *)local_80,(storage_error *)local_d8);
    *(undefined1 (*) [8])old_path.field_2._8_8_ = local_d8;
    *(undefined8 *)(old_path.field_2._8_8_ + 8) = se.ec._0_8_;
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)old_path.field_2._8_8_);
    if (!bVar1) {
      remove((libtorrent *)local_40,(char *)old_path.field_2._8_8_);
      goto LAB_005309bb;
    }
    bVar1 = true;
  }
  else {
LAB_005309bb:
    bVar1 = false;
  }
  ::std::__cxx11::string::~string((string *)local_80);
  ::std::__cxx11::string::~string((string *)local_40);
  if (bVar1) {
    return;
  }
LAB_005309f2:
  ::std::__cxx11::string::operator=((string *)this,(string *)path);
  return;
}

Assistant:

void posix_part_file::move_partfile(std::string const& path, error_code& ec)
	{
		flush_metadata_impl(ec);
		if (ec) return;

		if (!m_piece_map.empty())
		{
			std::string old_path = combine_path(m_path, m_name);
			std::string new_path = combine_path(path, m_name);

			rename(old_path, new_path, ec);
			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();

			if (ec)
			{
				storage_error se;
				aux::copy_file(old_path, new_path, se);
				ec = se.ec;
				if (ec) return;
				remove(old_path, ec);
			}
		}
		m_path = path;
	}